

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventCount.hpp
# Opt level: O0

void __thiscall EventCount::doNotify(EventCount *this,int n)

{
  ulong uVar1;
  atomic<unsigned_int> *in_RDI;
  uint64_t prev;
  
  LOCK();
  uVar1 = *(ulong *)in_RDI;
  *(long *)in_RDI = *(long *)in_RDI + 0x100000000;
  UNLOCK();
  if ((uVar1 & 0xffffffff) != 0) {
    futexWake<std::atomic<unsigned_int>>(in_RDI,(int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  }
  return;
}

Assistant:

inline void EventCount::doNotify(int n) noexcept {
    uint64_t prev = val_.fetch_add(kAddEpoch, std::memory_order_acq_rel);
    if (UNLIKELY(prev & kWaiterMask)) {
        futexWake(reinterpret_cast<Futex<std::atomic> *>(&val_) + kEpochOffset, n);
    }
}